

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_types.cpp
# Opt level: O3

UniValue * BanMapToJson(UniValue *__return_storage_ptr__,banmap_t *bans)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string key;
  UniValue val;
  UniValue val_00;
  _Base_ptr p_Var2;
  long in_FS_OFFSET;
  UniValue j;
  undefined8 in_stack_fffffffffffffe48;
  _Base_ptr p_Var3;
  VType in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  _Alloc_hider in_stack_fffffffffffffe68;
  size_type in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  undefined8 uVar4;
  pointer in_stack_fffffffffffffe88;
  pointer in_stack_fffffffffffffe90;
  pointer in_stack_fffffffffffffe98;
  pointer in_stack_fffffffffffffea0;
  pointer in_stack_fffffffffffffea8;
  pointer in_stack_fffffffffffffeb0;
  _Alloc_hider in_stack_fffffffffffffeb8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  UniValue local_128;
  long *local_d0 [2];
  long local_c0 [2];
  UniValue local_b0;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined8 local_47;
  undefined4 local_3f;
  undefined2 local_3b;
  char local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &local_48;
  __return_storage_ptr__->typ = VARR;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_47;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_3f;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_3b;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_39;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_50 = 0;
  local_48 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var2 = (bans->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(bans->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var2 != p_Var3) {
    paVar1 = &local_b0.val.field_2;
    do {
      CBanEntry::ToJson(&local_b0,(CBanEntry *)&p_Var2[2]._M_right);
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"address","");
      CSubNet::ToString_abi_cxx11_((string *)&stack0xfffffffffffffeb8,(CSubNet *)(p_Var2 + 1));
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_128,(string *)&stack0xfffffffffffffeb8);
      key._M_string_length = (size_type)__return_storage_ptr__;
      key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
      key.field_2._M_allocated_capacity = (size_type)p_Var3;
      key.field_2._8_4_ = in_stack_fffffffffffffe60;
      key.field_2._12_4_ = in_stack_fffffffffffffe64;
      val_00.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe70;
      val_00._0_8_ = in_stack_fffffffffffffe68._M_p;
      val_00.val._M_string_length = in_stack_fffffffffffffe78;
      val_00.val.field_2._M_allocated_capacity = in_stack_fffffffffffffe80;
      val_00.val.field_2._8_8_ = in_stack_fffffffffffffe88;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffffe90;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe98;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffea0;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = in_stack_fffffffffffffea8;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = in_stack_fffffffffffffeb0;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffeb8._M_p;
      UniValue::pushKV(&local_b0,key,val_00);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_128.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_128.keys);
      uVar4 = in_stack_fffffffffffffe80;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.val._M_dataplus._M_p != &local_128.val.field_2) {
        operator_delete(local_128.val._M_dataplus._M_p,
                        local_128.val.field_2._M_allocated_capacity + 1);
        uVar4 = in_stack_fffffffffffffe80;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffeb8._M_p != &local_138) {
        operator_delete(in_stack_fffffffffffffeb8._M_p,local_138._M_allocated_capacity + 1);
      }
      if (local_d0[0] != local_c0) {
        operator_delete(local_d0[0],local_c0[0] + 1);
      }
      in_stack_fffffffffffffeb0 =
           local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      in_stack_fffffffffffffea8 =
           local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      in_stack_fffffffffffffea0 =
           local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      in_stack_fffffffffffffe98 =
           (pointer)local_b0.keys.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      in_stack_fffffffffffffe90 =
           local_b0.keys.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      in_stack_fffffffffffffe88 =
           local_b0.keys.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      in_stack_fffffffffffffe70 = local_b0.val._M_string_length;
      in_stack_fffffffffffffe68._M_p = &stack0xfffffffffffffe78;
      in_stack_fffffffffffffe80 = local_b0.val.field_2._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.val._M_dataplus._M_p != paVar1) {
        in_stack_fffffffffffffe68._M_p = local_b0.val._M_dataplus._M_p;
        in_stack_fffffffffffffe80 = uVar4;
      }
      in_stack_fffffffffffffe78._1_7_ = local_b0.val.field_2._M_allocated_capacity._1_7_;
      in_stack_fffffffffffffe78._0_1_ = local_b0.val.field_2._M_local_buf[0];
      local_b0.val._M_string_length = 0;
      local_b0.val.field_2._M_local_buf[0] = '\0';
      local_b0.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b0.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b0.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      val.val._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      val._0_8_ = in_stack_fffffffffffffe48;
      val.val._M_string_length = (size_type)p_Var3;
      val.val.field_2._M_allocated_capacity._0_4_ = local_b0.typ;
      val.val.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffe64;
      val.val.field_2._8_8_ = in_stack_fffffffffffffe68._M_p;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe70;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe78;
      val.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe80;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe88;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe90;
      val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffe98;
      in_stack_fffffffffffffe60 = local_b0.typ;
      local_b0.val._M_dataplus._M_p = (pointer)paVar1;
      UniValue::push_back(__return_storage_ptr__,val);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector
                ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffea0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xfffffffffffffe88);
      if (in_stack_fffffffffffffe68._M_p != &stack0xfffffffffffffe78) {
        operator_delete(in_stack_fffffffffffffe68._M_p,in_stack_fffffffffffffe78 + 1);
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_b0.values);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b0.keys);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.val._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0.val._M_dataplus._M_p,
                        CONCAT71(local_b0.val.field_2._M_allocated_capacity._1_7_,
                                 local_b0.val.field_2._M_local_buf[0]) + 1);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2);
    } while (p_Var2 != p_Var3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

UniValue BanMapToJson(const banmap_t& bans)
{
    UniValue bans_json(UniValue::VARR);
    for (const auto& it : bans) {
        const auto& address = it.first;
        const auto& ban_entry = it.second;
        UniValue j = ban_entry.ToJson();
        j.pushKV(BANMAN_JSON_ADDR_KEY, address.ToString());
        bans_json.push_back(std::move(j));
    }
    return bans_json;
}